

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O3

void __thiscall tetgenmesh::outedges(tetgenmesh *this,tetgenio *out)

{
  tetrahedron *pppdVar1;
  memorypool *pmVar2;
  void **ppvVar3;
  tetrahedron ppdVar4;
  point pdVar5;
  bool bVar6;
  int *piVar7;
  long lVar8;
  tetrahedron *pppdVar9;
  tetrahedron *pppdVar10;
  tetgenbehavior *ptVar11;
  size_t sVar12;
  FILE *pFVar13;
  undefined4 *puVar14;
  uint uVar15;
  long lVar16;
  long lVar17;
  int iVar18;
  ulong uVar19;
  long lVar20;
  ulong uVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  uint *puVar25;
  uint local_478;
  int *local_460;
  int local_450;
  int local_44c;
  int local_448;
  int local_444;
  double *local_440;
  char edgefilename [1024];
  
  ptVar11 = this->b;
  if (out == (tetgenio *)0x0) {
    strcpy(edgefilename,ptVar11->outfilename);
    sVar12 = strlen(edgefilename);
    builtin_strncpy(edgefilename + sVar12,".edge",6);
    if (ptVar11->quiet == 0) {
      printf("Writing %s.\n",edgefilename);
    }
  }
  else if (ptVar11->quiet == 0) {
    puts("Writing edges.");
  }
  if (this->meshedges == 0) {
    if (this->nonconvex == 0) {
      uVar19 = this->tetrahedrons->items - this->hullsize;
      if (this->b->weighted == 0) {
        lVar8 = 0;
      }
      else {
        lVar8 = this->nonregularcount;
      }
      this->meshedges =
           (~uVar19 + this->points->items + (long)(this->hullsize + uVar19 * 4) / 2) -
           (this->dupverts + this->unuverts + lVar8);
    }
    else {
      numberedges(this);
    }
  }
  this->meshhulledges = 0;
  if (out == (tetgenio *)0x0) {
    pFVar13 = fopen(edgefilename,"w");
    if (pFVar13 == (FILE *)0x0) {
      printf("File I/O Error:  Cannot create file %s.\n",edgefilename);
      puVar14 = (undefined4 *)__cxa_allocate_exception(4);
      *puVar14 = 1;
      __cxa_throw(puVar14,&int::typeinfo,0);
    }
    fprintf(pFVar13,"%ld  %d\n",this->meshedges,(ulong)(this->b->nobound == 0));
    ptVar11 = this->b;
  }
  else {
    uVar19 = this->meshedges;
    out->numberofedges = (int)uVar19;
    piVar7 = (int *)operator_new__(-(ulong)((uVar19 & 0x6000000000000000) != 0) | uVar19 * 8);
    out->edgelist = piVar7;
    ptVar11 = this->b;
    if (ptVar11->order == 2) {
      uVar21 = 0xffffffffffffffff;
      if (uVar19 < 0x4000000000000000) {
        uVar21 = uVar19 * 4;
      }
      piVar7 = (int *)operator_new__(uVar21);
      out->o2edgelist = piVar7;
    }
    if (ptVar11->nobound == 0) {
      uVar21 = 0xffffffffffffffff;
      if (uVar19 < 0x4000000000000000) {
        uVar21 = uVar19 * 4;
      }
      piVar7 = (int *)operator_new__(uVar21);
      out->edgemarkerlist = piVar7;
    }
    if (1 < ptVar11->neighout) {
      uVar21 = 0xffffffffffffffff;
      if (uVar19 < 0x4000000000000000) {
        uVar21 = uVar19 * 4;
      }
      piVar7 = (int *)operator_new__(uVar21);
      out->edge2tetlist = piVar7;
    }
    pFVar13 = (FILE *)0x0;
  }
  local_460 = (int *)0x0;
  if (1 < ptVar11->neighout) {
    lVar8 = this->tetrahedrons->items - this->hullsize;
    uVar19 = 0xffffffffffffffff;
    if ((ulong)(lVar8 * 6) < 0x4000000000000000) {
      uVar19 = lVar8 * 0x18;
    }
    local_460 = (int *)operator_new__(uVar19);
  }
  pmVar2 = this->tetrahedrons;
  iVar23 = this->in->firstnumber;
  iVar18 = 0;
  if (ptVar11->zeroindex == 0) {
    iVar18 = iVar23;
  }
  ppvVar3 = pmVar2->firstblock;
  pmVar2->pathblock = ppvVar3;
  pmVar2->pathitem =
       (void *)((long)ppvVar3 +
               (((long)pmVar2->alignbytes + 8U) -
               (ulong)(ppvVar3 + 1) % (ulong)(long)pmVar2->alignbytes));
  pmVar2->pathitemsleft = pmVar2->itemsperblock;
  pppdVar9 = tetrahedrontraverse(this);
  if (pppdVar9 != (tetrahedron *)0x0) {
    local_444 = 0;
    local_450 = 0;
    local_448 = 0;
    local_44c = 0;
    local_440 = (double *)0x0;
    iVar22 = iVar18;
    do {
      lVar8 = 0;
      do {
        local_478 = (uint)(iVar23 == 1 && iVar18 == 0);
        iVar24 = edge2ver[lVar8];
        pppdVar10 = (tetrahedron *)((ulong)pppdVar9[facepivot1[iVar24]] & 0xfffffffffffffff0);
        piVar7 = facepivot2[iVar24] + ((uint)pppdVar9[facepivot1[iVar24]] & 0xf);
        bVar6 = false;
        do {
          if (pppdVar10[7] == (tetrahedron)this->dummypoint) {
            bVar6 = true;
          }
          else if (*(int *)(pppdVar10 + 10) < *(int *)(pppdVar9 + 10)) {
            if (pppdVar10 != pppdVar9) goto LAB_001550e6;
            break;
          }
          pppdVar1 = pppdVar10 + facepivot1[*piVar7];
          pppdVar10 = (tetrahedron *)((ulong)*pppdVar1 & 0xfffffffffffffff0);
          piVar7 = facepivot2[*piVar7] + ((uint)*pppdVar1 & 0xf);
        } while (pppdVar9 != pppdVar10);
        if (bVar6) {
          this->meshhulledges = this->meshhulledges + 1;
        }
        ppdVar4 = pppdVar9[destpivot[iVar24]];
        ptVar11 = this->b;
        if (ptVar11->order == 2) {
          local_440 = pppdVar9[0xb][ver2edge[iVar24]];
        }
        uVar15 = *(int *)((long)pppdVar9[orgpivot[iVar24]] + (long)this->pointmarkindex * 4) -
                 local_478;
        if (out == (tetgenio *)0x0) {
          fprintf(pFVar13,"%5d   %4d  %4d",iVar22,(ulong)uVar15,
                  (ulong)(*(int *)((long)ppdVar4 + (long)this->pointmarkindex * 4) - local_478));
          ptVar11 = this->b;
          if (ptVar11->order == 2) {
            fprintf(pFVar13,"  %4d",
                    (ulong)(*(int *)((long)local_440 + (long)this->pointmarkindex * 4) - local_478))
            ;
            ptVar11 = this->b;
          }
        }
        else {
          piVar7 = out->edgelist;
          lVar17 = (long)local_444;
          piVar7[lVar17] = uVar15;
          local_444 = local_444 + 2;
          piVar7[lVar17 + 1] = *(int *)((long)ppdVar4 + (long)this->pointmarkindex * 4) - local_478;
          if (ptVar11->order == 2) {
            lVar17 = (long)local_448;
            local_448 = local_448 + 1;
            out->o2edgelist[lVar17] =
                 *(int *)((long)local_440 + (long)this->pointmarkindex * 4) - local_478;
          }
        }
        if (ptVar11->nobound == 0) {
          if ((ptVar11->plc == 0) && (ptVar11->refine == 0)) {
            uVar15 = (uint)bVar6;
          }
          else {
            uVar15 = 0;
            if ((pppdVar9[8] != (tetrahedron)0x0) &&
               (uVar19 = (ulong)pppdVar9[8][ver2edge[iVar24]] & 0xfffffffffffffff8, uVar19 != 0)) {
              uVar15 = *(uint *)(uVar19 + (long)this->shmarkindex * 4);
            }
          }
          if (out == (tetgenio *)0x0) {
            fprintf(pFVar13,"  %d");
            if (1 < this->b->neighout) goto LAB_00155026;
            goto LAB_001550b8;
          }
          lVar17 = (long)local_450;
          local_450 = local_450 + 1;
          out->edgemarkerlist[lVar17] = uVar15;
          if (1 < ptVar11->neighout) goto LAB_00154fe4;
        }
        else {
          if (1 < ptVar11->neighout) {
            if (out == (tetgenio *)0x0) {
LAB_00155026:
              fprintf(pFVar13,"  %d",(ulong)*(uint *)(pppdVar9 + 10));
            }
            else {
LAB_00154fe4:
              lVar17 = (long)local_44c;
              local_44c = local_44c + 1;
              out->edge2tetlist[lVar17] = *(int *)(pppdVar9 + 10);
            }
            ppdVar4 = (tetrahedron)this->dummypoint;
            pppdVar10 = pppdVar9;
            do {
              if (pppdVar10[7] != ppdVar4) {
                local_460[(long)ver2edge[iVar24] +
                          ((long)*(int *)(pppdVar10 + 10) - (long)iVar18) * 6] = iVar22;
              }
              pppdVar1 = pppdVar10 + facepivot1[iVar24];
              pppdVar10 = (tetrahedron *)((ulong)*pppdVar1 & 0xfffffffffffffff0);
              iVar24 = facepivot2[iVar24][(uint)*pppdVar1 & 0xf];
            } while (pppdVar9 != pppdVar10);
          }
          if (out == (tetgenio *)0x0) {
LAB_001550b8:
            fputc(10,pFVar13);
          }
        }
        iVar22 = iVar22 + 1;
LAB_001550e6:
        lVar8 = lVar8 + 1;
      } while (lVar8 != 6);
      pppdVar9 = tetrahedrontraverse(this);
    } while (pppdVar9 != (tetrahedron *)0x0);
  }
  if (out == (tetgenio *)0x0) {
    fprintf(pFVar13,"# Generated by %s\n",this->b->commandline);
    fclose(pFVar13);
  }
  ptVar11 = this->b;
  if (ptVar11->neighout < 2) {
    return;
  }
  pmVar2 = this->tetrahedrons;
  lVar8 = pmVar2->items - this->hullsize;
  if (ptVar11->facesout != 0) {
    lVar17 = this->hullsize + lVar8 * 4;
    lVar16 = lVar17 / 2;
    uVar19 = 0xffffffffffffffff;
    if ((ulong)(lVar16 * 3) < 0x4000000000000000) {
      uVar19 = lVar16 * 0xc;
    }
    piVar7 = (int *)operator_new__(uVar19);
    ppvVar3 = pmVar2->firstblock;
    pmVar2->pathblock = ppvVar3;
    iVar23 = 0;
    pmVar2->pathitem =
         (void *)((long)ppvVar3 +
                 (((long)pmVar2->alignbytes + 8U) -
                 (ulong)(ppvVar3 + 1) % (ulong)(long)pmVar2->alignbytes));
    pmVar2->pathitemsleft = pmVar2->itemsperblock;
    pppdVar9 = tetrahedrontraverse(this);
    while (pppdVar9 != (tetrahedron *)0x0) {
      pdVar5 = this->dummypoint;
      iVar22 = *(int *)(pppdVar9 + 10);
      uVar19 = 0;
      do {
        if ((*(point *)(((ulong)pppdVar9[uVar19] & 0xfffffffffffffff0) + 0x38) == pdVar5) ||
           (iVar22 < *(int *)(((ulong)pppdVar9[uVar19] & 0xfffffffffffffff0) + 0x50))) {
          lVar20 = 0;
          uVar21 = uVar19 & 0xffffffff;
          do {
            uVar21 = (ulong)enexttbl[(int)uVar21];
            piVar7[iVar23 * 3 + lVar20] =
                 local_460[(long)ver2edge[uVar21] + (long)(iVar22 - iVar18) * 6];
            lVar20 = lVar20 + 1;
          } while (lVar20 != 3);
          iVar23 = iVar23 + 1;
        }
        uVar19 = uVar19 + 1;
      } while (uVar19 != 4);
      pppdVar9 = tetrahedrontraverse(this);
    }
    ptVar11 = this->b;
    if (out != (tetgenio *)0x0) {
      if (ptVar11->quiet == 0) {
        puts("Writing face-to-edge map.");
        ptVar11 = this->b;
      }
      out->face2edgelist = piVar7;
      goto LAB_001553b2;
    }
    strcpy(edgefilename,ptVar11->outfilename);
    sVar12 = strlen(edgefilename);
    builtin_strncpy(edgefilename + sVar12,".f2e",5);
    if (ptVar11->quiet == 0) {
      printf("Writing %s.\n",edgefilename);
    }
    pFVar13 = fopen(edgefilename,"w");
    if (1 < lVar17) {
      puVar25 = (uint *)(piVar7 + 2);
      lVar17 = 0;
      do {
        fprintf(pFVar13,"%4d  %d %d %d\n",(ulong)(uint)(this->in->firstnumber + (int)lVar17),
                (ulong)puVar25[-2],(ulong)puVar25[-1],(ulong)*puVar25);
        lVar17 = lVar17 + 1;
        puVar25 = puVar25 + 3;
      } while (lVar16 != lVar17);
    }
    fclose(pFVar13);
    operator_delete__(piVar7);
    ptVar11 = this->b;
  }
  if (out == (tetgenio *)0x0) {
    strcpy(edgefilename,ptVar11->outfilename);
    sVar12 = strlen(edgefilename);
    builtin_strncpy(edgefilename + sVar12,".t2e",5);
    if (ptVar11->quiet == 0) {
      printf("Writing %s.\n",edgefilename);
    }
    pFVar13 = fopen(edgefilename,"w");
    if (lVar8 < 1) {
      fclose(pFVar13);
      if (local_460 == (int *)0x0) {
        return;
      }
    }
    else {
      puVar25 = (uint *)(local_460 + 5);
      lVar17 = 0;
      do {
        fprintf(pFVar13,"%4d  %d %d %d %d %d %d\n",
                (ulong)(uint)(this->in->firstnumber + (int)lVar17),(ulong)puVar25[-5],
                (ulong)puVar25[-4],(ulong)puVar25[-3],(ulong)puVar25[-2],(ulong)puVar25[-1],
                (ulong)*puVar25);
        lVar17 = lVar17 + 1;
        puVar25 = puVar25 + 6;
      } while (lVar8 != lVar17);
      fclose(pFVar13);
    }
    operator_delete__(local_460);
    return;
  }
LAB_001553b2:
  if (ptVar11->quiet == 0) {
    puts("Writing tetrahedron-to-edge map.");
  }
  out->tet2edgelist = local_460;
  return;
}

Assistant:

void tetgenmesh::outedges(tetgenio* out)
{
  FILE *outfile = NULL;
  char edgefilename[FILENAMESIZE];
  triface tetloop, worktet, spintet;
  face checkseg;
  point torg, tdest;
  int ishulledge;
  int firstindex, shift;
  int edgenumber, marker;
  int index = 0, index1 = 0, index2 = 0;
  int t1ver;
  int i;

  // For -o2 option.
  point *extralist, pp = NULL; 
  int highorderindex = 11;
  int o2index = 0;

  // For -nn option.
  int *tet2edgelist = NULL;
  int tidx;

  if (out == (tetgenio *) NULL) {
    strcpy(edgefilename, b->outfilename);
    strcat(edgefilename, ".edge");
  }

  if (!b->quiet) {
    if (out == (tetgenio *) NULL) {
      printf("Writing %s.\n", edgefilename);
    } else {
      printf("Writing edges.\n");
    }
  }

  if (meshedges == 0l) {
    if (nonconvex) {
      numberedges();  // Count the edges.
    } else {
      // Use Euler's characteristic to get the numbe of edges.
      // It states V - E + F - C = 1, hence E = V + F - C - 1.
      long tsize = tetrahedrons->items - hullsize;
      long fsize = (tsize * 4l + hullsize) / 2l;
      long vsize = points->items - dupverts - unuverts;
      if (b->weighted) vsize -= nonregularcount;
      meshedges = vsize + fsize - tsize - 1;
    }
  }
  meshhulledges = 0l; // It will be counted.

  if (out == (tetgenio *) NULL) {
    outfile = fopen(edgefilename, "w");
    if (outfile == (FILE *) NULL) {
      printf("File I/O Error:  Cannot create file %s.\n", edgefilename);
      terminatetetgen(this, 1);
    }
    // Write the number of edges, boundary markers (0 or 1).
    fprintf(outfile, "%ld  %d\n", meshedges, !b->nobound);
  } else {
    // Allocate memory for 'edgelist'.
    out->numberofedges = meshedges;
    out->edgelist = new int[meshedges * 2];
    if (out->edgelist == (int *) NULL) {
      printf("Error:  Out of memory.\n");
      terminatetetgen(this, 1);
    }
    if (b->order == 2) { // -o2 switch
      out->o2edgelist = new int[meshedges];
    }
    if (!b->nobound) {
      out->edgemarkerlist = new int[meshedges];
    }
    if (b->neighout > 1) { // '-nn' switch.
      out->edge2tetlist = new int[meshedges];
    }
  }

  if (b->neighout > 1) { // -nn option
    // Output the tetrahedron-to-edge map.
	long tsize = tetrahedrons->items - hullsize;
    tet2edgelist = new int[tsize * 6];
  }

  // Determine the first index (0 or 1).
  firstindex = b->zeroindex ? 0 : in->firstnumber;
  shift = 0; // Default no shiftment.
  if ((in->firstnumber == 1) && (firstindex == 0)) {
    shift = 1; // Shift (reduce) the output indices by 1.
  }

  tetrahedrons->traversalinit();
  tetloop.tet = tetrahedrontraverse();
  edgenumber = firstindex; // in->firstnumber;
  while (tetloop.tet != (tetrahedron *) NULL) {
    // Count the number of Voronoi faces. 
    worktet.tet = tetloop.tet;
    for (i = 0; i < 6; i++) {
      worktet.ver = edge2ver[i];
      ishulledge = 0;
      fnext(worktet, spintet);
      do {
        if (!ishulltet(spintet)) {
          if (elemindex(spintet.tet) < elemindex(worktet.tet)) break;
        } else {
          ishulledge = 1;
        }
        fnextself(spintet);
      } while (spintet.tet != worktet.tet);
      if (spintet.tet == worktet.tet) {
        // Found a new edge.
        if (ishulledge) meshhulledges++;
        torg = org(worktet);
        tdest = dest(worktet);
        if (b->order == 2) { // -o2
          // Get the extra vertex on this edge.
          extralist = (point *) worktet.tet[highorderindex];
          pp = extralist[ver2edge[worktet.ver]];
        }
        if (out == (tetgenio *) NULL) {
          fprintf(outfile, "%5d   %4d  %4d", edgenumber,
                  pointmark(torg) - shift, pointmark(tdest) - shift);
          if (b->order == 2) { // -o2
            fprintf(outfile, "  %4d", pointmark(pp) - shift);
          }
        } else {
          // Output three vertices of this face;
          out->edgelist[index++] = pointmark(torg) - shift;
          out->edgelist[index++] = pointmark(tdest) - shift;
          if (b->order == 2) { // -o2
            out->o2edgelist[o2index++] = pointmark(pp) - shift;
          }
        }
        if (!b->nobound) {
          if (b->plc || b->refine) {
            // Check if the edge is a segment.
            tsspivot1(worktet, checkseg);
            if (checkseg.sh != NULL) {
              marker = shellmark(checkseg);
            } else {
              marker = 0;  // It's not a segment.
            }
          } else {
            // Mark it if it is a hull edge.
            marker = ishulledge ? 1 : 0;
          }
          if (out == (tetgenio *) NULL) {
            fprintf(outfile, "  %d", marker);
          } else {
            out->edgemarkerlist[index1++] = marker;
          }
        }
        if (b->neighout > 1) { // '-nn' switch.
          if (out == (tetgenio *) NULL) {
            fprintf(outfile, "  %d", elemindex(tetloop.tet));
          } else {
            out->edge2tetlist[index2++] = elemindex(tetloop.tet);
          }
		  // Fill the tetrahedron-to-edge map.
		  spintet = worktet;
		  while (1) {
		    if (!ishulltet(spintet)) {
			  tidx = elemindex(spintet.tet) - firstindex;
			  tet2edgelist[tidx * 6 + ver2edge[spintet.ver]] = edgenumber;
			}
		    fnextself(spintet);
			if (spintet.tet == worktet.tet) break;
		  }
        }
        if (out == (tetgenio *) NULL) {
          fprintf(outfile, "\n");
        }
        edgenumber++;
      }
    }
    tetloop.tet = tetrahedrontraverse();
  }

  if (out == (tetgenio *) NULL) {
    fprintf(outfile, "# Generated by %s\n", b->commandline);
    fclose(outfile);
  }

  if (b->neighout > 1) { // -nn option
    long tsize = tetrahedrons->items - hullsize;

    if (b->facesout) { // -f option
      // Build the face-to-edge map (use the tet-to-edge map).
	  long fsize = (tsize * 4l + hullsize) / 2l;
	  int *face2edgelist = new int[fsize * 3];

	  tetrahedrons->traversalinit();
      tetloop.tet = tetrahedrontraverse();
      int facenumber = 0; // firstindex; // in->firstnumber;
	  while (tetloop.tet != (tetrahedron *) NULL) {
	    for (tetloop.ver = 0; tetloop.ver < 4; tetloop.ver++) {
		  fsym(tetloop, spintet);
		  if (ishulltet(spintet) || 
              (elemindex(tetloop.tet) < elemindex(spintet.tet))) {
            // The three edges of this face are ordered such that the
			//    first edge is opposite to the first vertex of this face
			//    that appears in the .face file, and so on.
			tidx = elemindex(tetloop.tet) - firstindex; 
			worktet = tetloop;
            for (i = 0; i < 3; i++) {
			  enextself(worktet); // The edge opposite to vertex i.
			  int eidx = tet2edgelist[tidx * 6 + ver2edge[worktet.ver]];
			  face2edgelist[facenumber * 3 + i] = eidx;
			}
		    facenumber++;
		  }
		}
	    tetloop.tet = tetrahedrontraverse();
	  }

	  // Output the face-to-edge map.
	  if (out == (tetgenio *) NULL) {
	    strcpy(edgefilename, b->outfilename);
        strcat(edgefilename, ".f2e");
      }
	  if (!b->quiet) {
        if (out == (tetgenio *) NULL) {
          printf("Writing %s.\n", edgefilename);
        } else {
          printf("Writing face-to-edge map.\n");
        }
      }
	  if (out == (tetgenio *) NULL) {
	    outfile = fopen(edgefilename, "w");
	    for (tidx = 0; tidx < fsize; tidx++) { // Re-use `tidx'
	      i = tidx * 3;
		  fprintf(outfile, "%4d  %d %d %d\n", tidx + in->firstnumber,
		          face2edgelist[i], face2edgelist[i+1], face2edgelist[i+2]);
	    }
	    fclose(outfile);
	    delete [] face2edgelist;
	  } else {
	    // Simply copy the address of the list to the output.
	    out->face2edgelist = face2edgelist;
      }
    } // if (b->facesout)

    // Output the tetrahedron-to-edge map.
	if (out == (tetgenio *) NULL) {
	  strcpy(edgefilename, b->outfilename);
      strcat(edgefilename, ".t2e");
    }
	if (!b->quiet) {
      if (out == (tetgenio *) NULL) {
        printf("Writing %s.\n", edgefilename);
      } else {
        printf("Writing tetrahedron-to-edge map.\n");
      }
    }
	if (out == (tetgenio *) NULL) {
	  outfile = fopen(edgefilename, "w");
	  for (tidx = 0; tidx < tsize; tidx++) {
	    i = tidx * 6;
		fprintf(outfile, "%4d  %d %d %d %d %d %d\n", tidx + in->firstnumber,
		        tet2edgelist[i], tet2edgelist[i+1], tet2edgelist[i+2],  
				tet2edgelist[i+3], tet2edgelist[i+4], tet2edgelist[i+5]);
	  }
	  fclose(outfile);
	  delete [] tet2edgelist;
	} else {
	  // Simply copy the address of the list to the output.
	  out->tet2edgelist = tet2edgelist;
    }
  }
}